

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::ShaderSubroutine::NegativeTest10::iterate(NegativeTest10 *this)

{
  Functions *gl_00;
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  long lVar4;
  TestLog *this_02;
  MessageBuilder *pMVar5;
  string *vs_body;
  string *tc_body;
  string *te_body;
  string *gs_body;
  string *fs_body;
  GLuint *local_2a0;
  GLuint *local_290;
  GLuint *local_280;
  GLuint *local_270;
  MessageBuilder local_218;
  uint local_94;
  reference local_90;
  _test_case *test_case;
  __normal_iterator<gl4cts::ShaderSubroutine::NegativeTest10::_test_case_*,_std::vector<gl4cts::ShaderSubroutine::NegativeTest10::_test_case,_std::allocator<gl4cts::ShaderSubroutine::NegativeTest10::_test_case>_>_>
  local_80;
  __normal_iterator<const_gl4cts::ShaderSubroutine::NegativeTest10::_test_case_*,_std::vector<gl4cts::ShaderSubroutine::NegativeTest10::_test_case,_std::allocator<gl4cts::ShaderSubroutine::NegativeTest10::_test_case>_>_>
  local_78;
  _test_cases_const_iterator test_case_iterator;
  allocator<char> local_59;
  string local_58;
  Functions *local_38;
  Functions *gl;
  NegativeTest10 *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  local_38 = (Functions *)CONCAT44(extraout_var,iVar2);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_shader_subroutine");
  if (bVar1) {
    initTestCases(this);
    local_80._M_current =
         (_test_case *)
         std::
         vector<gl4cts::ShaderSubroutine::NegativeTest10::_test_case,_std::allocator<gl4cts::ShaderSubroutine::NegativeTest10::_test_case>_>
         ::begin(&this->m_test_cases);
    __gnu_cxx::
    __normal_iterator<gl4cts::ShaderSubroutine::NegativeTest10::_test_case_const*,std::vector<gl4cts::ShaderSubroutine::NegativeTest10::_test_case,std::allocator<gl4cts::ShaderSubroutine::NegativeTest10::_test_case>>>
    ::__normal_iterator<gl4cts::ShaderSubroutine::NegativeTest10::_test_case*>
              ((__normal_iterator<gl4cts::ShaderSubroutine::NegativeTest10::_test_case_const*,std::vector<gl4cts::ShaderSubroutine::NegativeTest10::_test_case,std::allocator<gl4cts::ShaderSubroutine::NegativeTest10::_test_case>>>
                *)&local_78,&local_80);
    while( true ) {
      test_case = (_test_case *)
                  std::
                  vector<gl4cts::ShaderSubroutine::NegativeTest10::_test_case,_std::allocator<gl4cts::ShaderSubroutine::NegativeTest10::_test_case>_>
                  ::end(&this->m_test_cases);
      bVar1 = __gnu_cxx::operator!=
                        (&local_78,
                         (__normal_iterator<gl4cts::ShaderSubroutine::NegativeTest10::_test_case_*,_std::vector<gl4cts::ShaderSubroutine::NegativeTest10::_test_case,_std::allocator<gl4cts::ShaderSubroutine::NegativeTest10::_test_case>_>_>
                          *)&test_case);
      if (!bVar1) break;
      local_90 = __gnu_cxx::
                 __normal_iterator<const_gl4cts::ShaderSubroutine::NegativeTest10::_test_case_*,_std::vector<gl4cts::ShaderSubroutine::NegativeTest10::_test_case,_std::allocator<gl4cts::ShaderSubroutine::NegativeTest10::_test_case>_>_>
                 ::operator*(&local_78);
      gl_00 = local_38;
      vs_body = &local_90->vs_body;
      tc_body = &local_90->tc_body;
      te_body = &local_90->te_body;
      gs_body = &local_90->gs_body;
      fs_body = &local_90->fs_body;
      local_94 = 0;
      lVar4 = std::__cxx11::string::length();
      if (lVar4 == 0) {
        local_270 = (GLuint *)0x0;
      }
      else {
        local_270 = &this->m_tc_id;
      }
      lVar4 = std::__cxx11::string::length();
      if (lVar4 == 0) {
        local_280 = (GLuint *)0x0;
      }
      else {
        local_280 = &this->m_te_id;
      }
      lVar4 = std::__cxx11::string::length();
      if (lVar4 == 0) {
        local_290 = (GLuint *)0x0;
      }
      else {
        local_290 = &this->m_gs_id;
      }
      lVar4 = std::__cxx11::string::length();
      if (lVar4 == 0) {
        local_2a0 = (GLuint *)0x0;
      }
      else {
        local_2a0 = &this->m_fs_id;
      }
      bVar1 = Utils::buildProgram(gl_00,vs_body,tc_body,te_body,gs_body,fs_body,(GLchar **)0x0,
                                  &local_94,&this->m_vs_id,local_270,local_280,local_290,local_2a0,
                                  &this->m_po_id);
      if (bVar1) {
        this_02 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_218,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_218,
                            (char (*) [46])"A program object was successfully built for [");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_90->name);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(char (*) [41])"] test case, even though it was invalid.");
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_218);
        this->m_has_test_passed = false;
      }
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[3])();
      __gnu_cxx::
      __normal_iterator<const_gl4cts::ShaderSubroutine::NegativeTest10::_test_case_*,_std::vector<gl4cts::ShaderSubroutine::NegativeTest10::_test_case,_std::allocator<gl4cts::ShaderSubroutine::NegativeTest10::_test_case>_>_>
      ::operator++(&local_78);
    }
    if ((this->m_has_test_passed & 1U) == 0) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    return STOP;
  }
  test_case_iterator._M_current._3_1_ = 1;
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"GL_ARB_shader_subroutine is not supported.",&local_59);
  tcu::NotSupportedError::NotSupportedError(this_01,&local_58);
  test_case_iterator._M_current._3_1_ = 0;
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

tcu::TestNode::IterateResult NegativeTest10::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Form test cases */
	initTestCases();

	/* Iterate over all test cases */
	for (_test_cases_const_iterator test_case_iterator = m_test_cases.begin(); test_case_iterator != m_test_cases.end();
		 ++test_case_iterator)
	{
		const _test_case& test_case = *test_case_iterator;

		/* Try to build the program object */
		if (ShaderSubroutine::Utils::buildProgram(gl, test_case.vs_body, test_case.tc_body, test_case.te_body,
												  test_case.gs_body, test_case.fs_body, DE_NULL, /* xfb_varyings */
												  0,											 /* n_xfb_varyings */
												  &m_vs_id, (test_case.tc_body.length() > 0) ? &m_tc_id : DE_NULL,
												  (test_case.te_body.length() > 0) ? &m_te_id : DE_NULL,
												  (test_case.gs_body.length() > 0) ? &m_gs_id : DE_NULL,
												  (test_case.fs_body.length() > 0) ? &m_fs_id : DE_NULL, &m_po_id))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "A program object was successfully built for ["
							   << test_case.name << "] test case, even though it was invalid."
							   << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}

		/* Delete any objects that may have been created */
		deinit();
	} /* for (all test cases) */

	/** All done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}